

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  mbedtls_mpi *pmVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  mbedtls_mpi_uint mVar5;
  byte bVar6;
  ulong uVar7;
  bool bVar8;
  undefined1 local_70 [8];
  mbedtls_mpi T;
  mbedtls_mpi_uint local_50;
  mbedtls_mpi_uint d;
  mbedtls_mpi *local_40;
  char local_31;
  
  iVar2 = -4;
  if (0xfffffff0 < radix - 0x11U) {
    T.p._0_4_ = 1;
    local_70 = (undefined1  [8])0x0;
    local_31 = *s;
    if (local_31 == '\0') {
      mbedtls_mpi_free(X);
      iVar2 = 0;
    }
    else {
      bVar8 = local_31 == '-';
      T._8_8_ = s + bVar8;
      local_40 = X;
      d = strlen((char *)T._8_8_);
      pmVar1 = local_40;
      if (radix == 0x10) {
        if (d >> 0x3e != 0) {
          return -4;
        }
        iVar2 = mbedtls_mpi_grow(local_40,((d >> 4) + 1) - (ulong)((d & 0xf) == 0));
        if ((iVar2 == 0) && (iVar2 = mbedtls_mpi_lset(pmVar1,0), iVar2 == 0)) {
          pcVar4 = s + bVar8 + d;
          bVar6 = 0;
          for (uVar7 = 0; pcVar4 = pcVar4 + -1, d != uVar7; uVar7 = uVar7 + 1) {
            iVar2 = mpi_get_digit(&local_50,0x10,*pcVar4);
            if (iVar2 != 0) goto LAB_001e699f;
            local_40->p[uVar7 >> 4] = local_40->p[uVar7 >> 4] | local_50 << (bVar6 & 0x3c);
            bVar6 = bVar6 + 4;
          }
LAB_001e6a14:
          pmVar1 = local_40;
          iVar2 = 0;
          if ((local_31 == '-') && (sVar3 = mbedtls_mpi_bitlen(local_40), sVar3 != 0)) {
            pmVar1->s = -1;
          }
        }
      }
      else {
        iVar2 = mbedtls_mpi_lset(local_40,0);
        pmVar1 = local_40;
        if (iVar2 == 0) {
          mVar5 = 0;
          do {
            if (d == mVar5) goto LAB_001e6a14;
            iVar2 = mpi_get_digit(&local_50,radix,*(char *)(T._8_8_ + mVar5));
            if ((iVar2 != 0) ||
               (iVar2 = mbedtls_mpi_mul_int((mbedtls_mpi *)local_70,pmVar1,(ulong)(uint)radix),
               iVar2 != 0)) break;
            iVar2 = mbedtls_mpi_add_int(pmVar1,(mbedtls_mpi *)local_70,local_50);
            mVar5 = mVar5 + 1;
          } while (iVar2 == 0);
        }
      }
LAB_001e699f:
      mbedtls_mpi_free((mbedtls_mpi *)local_70);
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(s != NULL);

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}